

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

bool __thiscall cfd::core::AbstractTxIn::IsCoinBase(AbstractTxIn *this)

{
  undefined1 (*pauVar1) [16];
  value_type_conflict *__val;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ByteData local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  pauVar1 = (undefined1 (*) [16])operator_new(0x20);
  *pauVar1 = (undefined1  [16])0x0;
  pauVar1[1] = (undefined1  [16])0x0;
  if (this->vout_ == 0xffffffff) {
    Txid::GetData(&local_48,&this->txid_);
    ByteData::GetBytes(&local_30,&local_48);
    if ((long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 0x20) {
      if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar2 = true;
      }
      else {
        auVar4[0] = -((*pauVar1)[0] ==
                     *local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
        auVar4[1] = -((*pauVar1)[1] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[1]);
        auVar4[2] = -((*pauVar1)[2] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[2]);
        auVar4[3] = -((*pauVar1)[3] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[3]);
        auVar4[4] = -((*pauVar1)[4] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[4]);
        auVar4[5] = -((*pauVar1)[5] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[5]);
        auVar4[6] = -((*pauVar1)[6] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[6]);
        auVar4[7] = -((*pauVar1)[7] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[7]);
        auVar4[8] = -((*pauVar1)[8] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[8]);
        auVar4[9] = -((*pauVar1)[9] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[9]);
        auVar4[10] = -((*pauVar1)[10] ==
                      local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[10]);
        auVar4[0xb] = -((*pauVar1)[0xb] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0xb]);
        auVar4[0xc] = -((*pauVar1)[0xc] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0xc]);
        auVar4[0xd] = -((*pauVar1)[0xd] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0xd]);
        auVar4[0xe] = -((*pauVar1)[0xe] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0xe]);
        auVar4[0xf] = -((*pauVar1)[0xf] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0xf]);
        auVar3[0] = -(pauVar1[1][0] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x10]);
        auVar3[1] = -(pauVar1[1][1] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x11]);
        auVar3[2] = -(pauVar1[1][2] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x12]);
        auVar3[3] = -(pauVar1[1][3] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x13]);
        auVar3[4] = -(pauVar1[1][4] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x14]);
        auVar3[5] = -(pauVar1[1][5] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x15]);
        auVar3[6] = -(pauVar1[1][6] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x16]);
        auVar3[7] = -(pauVar1[1][7] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x17]);
        auVar3[8] = -(pauVar1[1][8] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x18]);
        auVar3[9] = -(pauVar1[1][9] ==
                     local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[0x19]);
        auVar3[10] = -(pauVar1[1][10] ==
                      local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[0x1a]);
        auVar3[0xb] = -(pauVar1[1][0xb] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0x1b]);
        auVar3[0xc] = -(pauVar1[1][0xc] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0x1c]);
        auVar3[0xd] = -(pauVar1[1][0xd] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0x1d]);
        auVar3[0xe] = -(pauVar1[1][0xe] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0x1e]);
        auVar3[0xf] = -(pauVar1[1][0xf] ==
                       local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[0x1f]);
        auVar3 = auVar3 & auVar4;
        bVar2 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar2 = false;
  }
  operator_delete(pauVar1);
  return bVar2;
}

Assistant:

bool AbstractTxIn::IsCoinBase() const {
  bool is_coinbase = false;
  std::vector<uint8_t> empty_txid(kByteData256Length);
  if ((vout_ == std::numeric_limits<uint32_t>::max()) &&
      (txid_.GetData().GetBytes() == empty_txid)) {
    is_coinbase = true;
  }
  return is_coinbase;
}